

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSourceArrayLoader14.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SourceArrayLoader14::begin__param(SourceArrayLoader14 *this)

{
  param__AttributeData *in_RSI;
  
  begin__param((SourceArrayLoader14 *)&this[-1].super_IParserImpl14.super_ColladaParserAutoGen14,
               in_RSI);
  return;
}

Assistant:

bool SourceArrayLoader14::begin__param( const COLLADASaxFWL14::param__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__param(attributeData));
COLLADASaxFWL::param__AttributeData attrData;
attrData.name = attributeData.name;
attrData.sid = attributeData.sid;
attrData.semantic = attributeData.semantic;
attrData.type = attributeData.type;
return mLoader->begin__param(attrData);
}